

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotScatterEx<ImPlot::GetterXsYs<float>>(char *label_id,GetterXsYs<float> *getter)

{
  GetterXsYs<float> getter_00;
  GetterXsYs<float> getter_01;
  GetterXsYs<float> getter_02;
  GetterXsYs<float> getter_03;
  bool bVar1;
  ImPlotScale IVar2;
  ImU32 local_f0;
  TransformerLogLog local_ec;
  float *local_e8;
  float *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  TransformerLinLog local_c4;
  float *local_c0;
  float *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  TransformerLogLin local_9c;
  float *local_98;
  float *local_90;
  undefined8 local_88;
  undefined8 local_80;
  TransformerLinLin local_74;
  float *local_70;
  float *local_68;
  undefined8 local_60;
  undefined8 local_58;
  ImU32 local_4c;
  ImU32 local_48;
  ImU32 col_fill;
  ImU32 col_line;
  ImPlotMarker marker;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p;
  int i;
  GetterXsYs<float> *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,2);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _s = GetterXsYs<float>::operator()(getter,p.y._4_4_);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    _col_line = GetPlotDrawList();
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) == -1) {
      local_f0 = 0;
    }
    else {
      local_f0 = *(ImU32 *)((long)&DrawList->_IdxWritePtr + 4);
    }
    col_fill = local_f0;
    if (local_f0 != 0xffffffff) {
      PopPlotClipRect();
      PushPlotClipRect((float)(DrawList->_ClipRectStack).Size);
      local_48 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_4c = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        local_70 = getter->Xs;
        local_68 = getter->Ys;
        local_60._0_4_ = getter->Count;
        local_60._4_4_ = getter->Offset;
        local_58 = *(undefined8 *)&getter->Stride;
        TransformerLinLin::TransformerLinLin(&local_74);
        getter_00.Ys = local_68;
        getter_00.Xs = local_70;
        getter_00.Count = (undefined4)local_60;
        getter_00.Offset = local_60._4_4_;
        getter_00._24_8_ = local_58;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<float>>
                  (getter_00,local_74,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 1:
        local_98 = getter->Xs;
        local_90 = getter->Ys;
        local_88._0_4_ = getter->Count;
        local_88._4_4_ = getter->Offset;
        local_80 = *(undefined8 *)&getter->Stride;
        TransformerLogLin::TransformerLogLin(&local_9c);
        getter_01.Ys = local_90;
        getter_01.Xs = local_98;
        getter_01.Count = (undefined4)local_88;
        getter_01.Offset = local_88._4_4_;
        getter_01._24_8_ = local_80;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<float>>
                  (getter_01,local_9c,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 2:
        local_c0 = getter->Xs;
        local_b8 = getter->Ys;
        local_b0._0_4_ = getter->Count;
        local_b0._4_4_ = getter->Offset;
        local_a8 = *(undefined8 *)&getter->Stride;
        TransformerLinLog::TransformerLinLog(&local_c4);
        getter_02.Ys = local_b8;
        getter_02.Xs = local_c0;
        getter_02.Count = (undefined4)local_b0;
        getter_02.Offset = local_b0._4_4_;
        getter_02._24_8_ = local_a8;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<float>>
                  (getter_02,local_c4,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 3:
        local_e8 = getter->Xs;
        local_e0 = getter->Ys;
        local_d8._0_4_ = getter->Count;
        local_d8._4_4_ = getter->Offset;
        local_d0 = *(undefined8 *)&getter->Stride;
        TransformerLogLog::TransformerLogLog(&local_ec);
        getter_03.Ys = local_e0;
        getter_03.Xs = local_e8;
        getter_03.Count = (undefined4)local_d8;
        getter_03.Offset = local_d8._4_4_;
        getter_03._24_8_ = local_d0;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<float>>
                  (getter_03,local_ec,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}